

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hkdf.c
# Opt level: O0

int kdf_hkdf_get_ctx_params(void *vctx,OSSL_PARAM *params)

{
  KDF_HKDF *ctx_00;
  OSSL_PARAM *p_00;
  size_t sz;
  OSSL_PARAM *p;
  KDF_HKDF *ctx;
  OSSL_PARAM *in_stack_ffffffffffffffc8;
  undefined4 local_4;
  
  ctx_00 = (KDF_HKDF *)OSSL_PARAM_locate(in_stack_ffffffffffffffc8,(char *)0x325359);
  if (ctx_00 == (KDF_HKDF *)0x0) {
    local_4 = -2;
  }
  else {
    p_00 = (OSSL_PARAM *)kdf_hkdf_size(ctx_00);
    if (p_00 == (OSSL_PARAM *)0x0) {
      local_4 = 0;
    }
    else {
      local_4 = OSSL_PARAM_set_size_t(p_00,(size_t)in_stack_ffffffffffffffc8);
    }
  }
  return local_4;
}

Assistant:

static int kdf_hkdf_get_ctx_params(void *vctx, OSSL_PARAM params[])
{
    KDF_HKDF *ctx = (KDF_HKDF *)vctx;
    OSSL_PARAM *p;

    if ((p = OSSL_PARAM_locate(params, OSSL_KDF_PARAM_SIZE)) != NULL) {
        size_t sz = kdf_hkdf_size(ctx);

        if (sz == 0)
            return 0;
        return OSSL_PARAM_set_size_t(p, sz);
    }
    return -2;
}